

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-reader.hh
# Opt level: O1

bool __thiscall tinyusdz::StreamReader::read8(StreamReader *this,int64_t *ret)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar2 = this->length_;
  uVar1 = this->idx_ + 8;
  if (uVar1 <= uVar2) {
    uVar3 = *(ulong *)(this->binary_ + this->idx_);
    if (this->swap_endian_ == true) {
      iVar4 = 8;
      iVar5 = 0x10;
      iVar6 = 0x18;
      iVar7 = 0x20;
      iVar8 = 0x28;
      iVar9 = 0x30;
      uVar11 = uVar3 & 0xff;
      uVar10 = uVar3 >> 0x38;
    }
    else {
      iVar9 = 8;
      iVar8 = 0x10;
      iVar7 = 0x18;
      iVar6 = 0x20;
      iVar5 = 0x28;
      iVar4 = 0x30;
      uVar11 = uVar3 >> 0x38;
      uVar10 = uVar3;
    }
    *ret = uVar10 & 0xff |
           (ulong)(((uint)(uVar3 >> iVar9) & 0xff) << 8) |
           (ulong)(((uint)(uVar3 >> iVar8) & 0xff) << 0x10) |
           (ulong)(uint)((int)(uVar3 >> iVar7) << 0x18) |
           (uVar3 >> iVar6 & 0xff) << 0x20 |
           (uVar3 >> iVar5 & 0xff) << 0x28 | (uVar3 >> iVar4 & 0xff) << 0x30 | uVar11 << 0x38;
    this->idx_ = this->idx_ + 8;
  }
  return uVar1 <= uVar2;
}

Assistant:

bool read8(int64_t *ret) const {
    if ((idx_ + 8) > length_) {
      return false;
    }

    int64_t val;
    memcpy(&val, &binary_[idx_], sizeof(val));

    if (swap_endian_) {
      swap8(&val);
    }

    (*ret) = val;
    idx_ += 8;

    return true;
  }